

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

date_t duckdb::TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts,interval_t offset)

{
  interval_t iVar1;
  bool bVar2;
  timestamp_t tVar3;
  undefined8 in_RCX;
  date_t in_EDX;
  int64_t in_R8;
  interval_t iVar4;
  int64_t ts_micros;
  int64_t bucket_width_micros;
  int64_t in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff68;
  undefined4 uVar5;
  date_t in_stack_ffffffffffffff9c;
  undefined4 uVar6;
  date_t in_stack_ffffffffffffffa0;
  interval_t local_18;
  int32_t local_4;
  
  bVar2 = duckdb::Value::IsFinite<duckdb::date_t>(in_EDX);
  if (bVar2) {
    duckdb::Interval::GetMicro(&local_18);
    tVar3 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(in_stack_ffffffffffffff9c);
    iVar1.micros = in_R8;
    iVar1._0_8_ = in_RCX;
    iVar4 = (interval_t)duckdb::Interval::Invert(iVar1);
    uVar5 = (undefined4)iVar4.micros;
    uVar6 = iVar4.micros._4_4_;
    tVar3.value = duckdb::Interval::Add(tVar3,iVar4);
    duckdb::Timestamp::GetEpochMicroSeconds(tVar3);
    tVar3 = WidthConvertibleToMicrosCommon
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                      );
    iVar4.micros = in_R8;
    iVar4._0_8_ = in_RCX;
    duckdb::Interval::Add(tVar3,iVar4);
    tVar3.value._4_4_ = uVar6;
    tVar3.value._0_4_ = uVar5;
    local_4 = (int32_t)Cast::Operation<duckdb::timestamp_t,duckdb::date_t>(tVar3);
  }
  else {
    local_4 = (int32_t)Cast::Operation<duckdb::date_t,duckdb::date_t>(in_stack_ffffffffffffffa0);
  }
  return (date_t)local_4;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(
			    Interval::Add(Cast::template Operation<TB, timestamp_t>(ts), Interval::Invert(offset)));
			return Cast::template Operation<timestamp_t, TR>(Interval::Add(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS), offset));
		}